

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O2

void __thiscall dtc::text_input_buffer::skip_spaces(text_input_buffer *this)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  
LAB_0013a29c:
  bVar1 = finished(this);
  if (bVar1) {
    return;
  }
  bVar1 = false;
  do {
    bVar2 = operator*(this);
    do {
      if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
        if ((bVar2 == 0x23) && (!(bool)(~bVar1 & this->cursor != 0))) {
          skip_to(this,'\n');
          skip_spaces(this);
        }
        bVar1 = consume(this,"/include/");
        if (!bVar1) {
          return;
        }
        handle_include(this);
        goto LAB_0013a29c;
      }
      bVar1 = bVar2 == 10 || bVar2 == 0xd;
      operator++(this);
      bVar3 = finished(this);
      bVar2 = 0;
    } while (bVar3);
  } while( true );
}

Assistant:

void
text_input_buffer::skip_spaces()
{
	if (finished()) { return; }
	char c = *(*this);
	bool last_nl = false;
	while ((c == ' ') || (c == '\t') || (c == '\n') || (c == '\f')
	       || (c == '\v') || (c == '\r'))
	{
		last_nl = ((c == '\n') || (c == '\r'));
		++(*this);
		if (finished())
		{
			c = '\0';
		}
		else
		{
			c = *(*this);
		}
	}
	// Skip C preprocessor leftovers
	if ((c == '#') && ((cursor == 0) || last_nl))
	{
		skip_to('\n');
		skip_spaces();
	}
	if (consume("/include/"))
	{
		handle_include();
		skip_spaces();
	}
}